

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::resolveReference(Value *this,char *key)

{
  ushort uVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  const_iterator __pos;
  CZString actualKey;
  value_type defaultValue;
  undefined1 local_1f0 [32];
  ValueHolder local_1d0;
  ushort local_1c8;
  ValueHolder local_1c0;
  ValueHolder local_1b8;
  ValueHolder VStack_1b0;
  ValueHolder local_1a8;
  uint local_1a0;
  Value local_198 [9];
  
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 == '\0') {
LAB_00140847:
    pcVar3 = (char *)operator_new(0x30);
    pcVar3[0x10] = '\0';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    pcVar3[0x18] = '\0';
    pcVar3[0x19] = '\0';
    pcVar3[0x1a] = '\0';
    pcVar3[0x1b] = '\0';
    pcVar3[0x1c] = '\0';
    pcVar3[0x1d] = '\0';
    pcVar3[0x1e] = '\0';
    pcVar3[0x1f] = '\0';
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\0';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    *(char **)(pcVar3 + 0x18) = pcVar3 + 8;
    *(char **)(pcVar3 + 0x20) = pcVar3 + 8;
    pcVar3[0x28] = '\0';
    pcVar3[0x29] = '\0';
    pcVar3[0x2a] = '\0';
    pcVar3[0x2b] = '\0';
    pcVar3[0x2c] = '\0';
    pcVar3[0x2d] = '\0';
    pcVar3[0x2e] = '\0';
    pcVar3[0x2f] = '\0';
    local_1d0.map_ = *(ObjectValues **)this;
    *(char **)this = pcVar3;
    *(ushort *)((long)this + 8) = uVar1 & 0xfe00 | 7;
    local_1c8 = uVar1 & 0x1ff;
    local_1c0 = *(ValueHolder *)((long)this + 0x10);
    ((ValueHolder *)((long)this + 0x10))->int_ = 0;
    local_1b8 = *(ValueHolder *)((long)this + 0x18);
    VStack_1b0 = *(ValueHolder *)((long)this + 0x20);
    ((ValueHolder *)((long)this + 0x18))->int_ = 0;
    ((ValueHolder *)((long)this + 0x20))->int_ = 0;
    ~Value((Value *)&local_1d0);
  }
  else if ((char)uVar1 != '\a') {
    this = (Value *)&local_1a8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"in Json::Value::resolveReference(): requires objectValue",0x38);
    std::__cxx11::stringbuf::str();
    throwLogicError((string *)local_1f0);
    goto LAB_00140847;
  }
  sVar4 = strlen(key);
  local_1f0._8_4_ = (int)sVar4 << 2;
  p_Var6 = ((*(ObjectValues **)this)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  __pos._M_node = &((*(ObjectValues **)this)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_1f0._0_8_ = key;
  if (p_Var6 != (_Base_ptr)0x0) {
    iVar5._M_node = __pos._M_node;
    do {
      bVar2 = CZString::operator<((CZString *)(p_Var6 + 1),(CZString *)local_1f0);
      if (!bVar2) {
        iVar5._M_node = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar2];
    } while (p_Var6 != (_Base_ptr)0x0);
    bVar2 = iVar5._M_node != __pos._M_node;
    __pos._M_node = iVar5._M_node;
    if ((bVar2) &&
       (bVar2 = CZString::operator==((CZString *)(iVar5._M_node + 1),(CZString *)local_1f0), bVar2))
    goto LAB_0014096c;
  }
  std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
            ((pair<const_Json::Value::CZString,_Json::Value> *)&local_1a8,(CZString *)local_1f0,
             (Value *)kNull);
  iVar5 = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    (*(_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                       **)this,__pos,(pair<const_Json::Value::CZString,_Json::Value> *)&local_1a8);
  ~Value(local_198);
  key = (char *)local_1f0._0_8_;
  if ((local_1a8 != (void *)0x0) && ((local_1a0 & 3) == 1)) {
    free(local_1a8.string_);
    key = (char *)local_1f0._0_8_;
  }
LAB_0014096c:
  if ((key != (char *)0x0) && ((local_1f0._8_4_ & 3) == 1)) {
    free(key);
  }
  return (Value *)&iVar5._M_node[1]._M_left;
}

Assistant:

Value& Value::resolveReference(const char* key) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::resolveReference(): requires objectValue");
  if (type_ == nullValue)
    *this = Value(objectValue);
  CZString actualKey(
      key, static_cast<unsigned>(strlen(key)), CZString::noDuplication); // NOTE!
  ObjectValues::iterator it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, nullRef);
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
}